

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O2

int remove_directory(mg_serve_http_opts *opts,char *dir)

{
  int iVar1;
  uint uVar2;
  DIR *__dirp;
  dirent64 *pdVar3;
  cs_stat_t st;
  char path [500];
  
  __dirp = opendir(dir);
  if (__dirp != (DIR *)0x0) {
    while( true ) {
      pdVar3 = readdir64(__dirp);
      if (pdVar3 == (dirent64 *)0x0) break;
      iVar1 = is_file_hidden(pdVar3->d_name,opts);
      if (iVar1 == 0) {
        snprintf(path,500,"%s%c%s",dir,0x2f,pdVar3->d_name);
        stat64(path,(stat64 *)&st);
        if ((st.st_mode & 0xf000) == 0x4000) {
          remove_directory(opts,path);
        }
        else {
          remove(path);
        }
      }
    }
    closedir(__dirp);
    uVar2 = rmdir(dir);
    __dirp = (DIR *)(ulong)uVar2;
  }
  return (int)__dirp;
}

Assistant:

static int remove_directory(const struct mg_serve_http_opts *opts,
                            const char *dir) {
    char path[MAX_PATH_SIZE];
    struct dirent *dp;
    cs_stat_t st;
    DIR *dirp;

    if ((dirp = opendir(dir)) == NULL) return 0;

    while ((dp = readdir(dirp)) != NULL) {
        if (is_file_hidden((const char *) dp->d_name, opts)) {
            continue;
        }
        snprintf(path, sizeof(path), "%s%c%s", dir, '/', dp->d_name);
        mg_stat(path, &st);
        if (S_ISDIR(st.st_mode)) {
            remove_directory(opts, path);
        } else {
            remove(path);
        }
    }
    closedir(dirp);
    rmdir(dir);

    return 1;
}